

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

bool __thiscall
MeCab::FeatureIndex::buildUnigramFeature(FeatureIndex *this,LearnerPath *path,char *ufeature)

{
  StringBuffer *this_00;
  pointer piVar1;
  mecab_learner_node_t *pmVar2;
  char cVar3;
  FeatureIndex *pFVar4;
  char **out;
  ostream *poVar5;
  int *__dest;
  pointer __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *extraout_RDX_01;
  void *__buf_00;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *__buf_01;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  size_t __n_00;
  char *pcVar6;
  char *p;
  int id;
  FeatureIndex *local_88;
  FeatureIndex *local_80;
  char *local_78;
  pointer local_70;
  pointer local_68;
  scoped_fixed_array<char_*,_64> F;
  scoped_fixed_array<char,_2048> ubuf;
  char *pcVar7;
  
  ubuf._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_00138ec0;
  local_78 = ufeature;
  pFVar4 = (FeatureIndex *)operator_new__(0x800);
  ubuf.size_ = 0x800;
  F._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_00138ef0;
  ubuf.ptr_ = (char *)pFVar4;
  out = (char **)operator_new__(0x200);
  F.size_ = 0x40;
  piVar1 = (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar1) {
    (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  F.ptr_ = out;
  strncpy((char *)pFVar4,local_78,0x800);
  local_68 = (pointer)tokenizeCSV<char**>((char *)pFVar4,out,0x40);
  local_80 = (FeatureIndex *)&this->feature_;
  __n = (this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->os_;
  __buf_01 = extraout_RDX;
  local_88 = this;
LAB_00109ec6:
  if (__n == (local_88->unigram_templs_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
    p = (char *)CONCAT44(p._4_4_,0xffffffff);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)local_80,(int *)&p);
    pFVar4 = local_88;
    __dest = ChunkFreeList<int>::alloc
                       (&local_88->feature_freelist_,
                        (long)(local_88->feature_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_88->feature_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2);
    path->rnode->fvector = __dest;
    piVar1 = (pFVar4->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    __n_00 = (long)(pFVar4->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar1;
    if (__n_00 != 0) {
      memmove(__dest,piVar1,__n_00);
      piVar1 = (pFVar4->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pFVar4->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar1) {
        (pFVar4->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar1;
      }
    }
    scoped_fixed_array<char_*,_64>::~scoped_fixed_array(&F);
    scoped_fixed_array<char,_2048>::~scoped_fixed_array(&ubuf);
    return true;
  }
  pcVar6 = *__n;
  (local_88->os_).size_ = 0;
  local_70 = __n;
  do {
    cVar3 = *pcVar6;
    if (cVar3 == '%') {
      pcVar7 = pcVar6 + 1;
      cVar3 = pcVar6[1];
      p = pcVar7;
      if (cVar3 == 'w') {
        pmVar2 = path->rnode;
        if (pmVar2->stat == '\0') {
          StringBuffer::write(this_00,(int)pmVar2->surface,(void *)(ulong)pmVar2->length,(size_t)__n
                             );
        }
LAB_00109fd1:
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                );
        poVar5 = std::operator<<(poVar5,"(");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x16b);
        poVar5 = std::operator<<(poVar5,") [");
        poVar5 = std::operator<<(poVar5,"false");
        poVar5 = std::operator<<(poVar5,"] ");
        poVar5 = std::operator<<(poVar5,"unknown meta char: ");
        std::operator<<(poVar5,*pcVar7);
        pFVar4 = (FeatureIndex *)&id;
        die::~die((die *)&id);
        __buf_01 = extraout_RDX_05;
      }
      else if (cVar3 == 't') {
        pFVar4 = (FeatureIndex *)this_00;
        StringBuffer::operator<<(this_00,(ulong)path->rnode->char_type);
        __buf_01 = extraout_RDX_03;
      }
      else if (cVar3 == 'u') {
        pFVar4 = (FeatureIndex *)this_00;
        StringBuffer::write(this_00,(int)local_78,__buf_01,(size_t)__n);
        __buf_01 = extraout_RDX_04;
      }
      else {
        if (cVar3 != 'F') goto LAB_00109fd1;
        __n = local_68;
        pcVar6 = getIndex(pFVar4,&p,F.ptr_,(size_t)local_68);
        __buf_01 = __buf_00;
        if (pcVar6 == (char *)0x0) goto LAB_0010a099;
        pFVar4 = (FeatureIndex *)this_00;
        StringBuffer::write(this_00,(int)pcVar6,__buf_00,(size_t)__n);
        __buf_01 = extraout_RDX_02;
        pcVar7 = p;
      }
    }
    else if (cVar3 == '\\') {
      p = pcVar6 + 1;
      cVar3 = getEscapedChar(pcVar6[1]);
      pFVar4 = (FeatureIndex *)this_00;
      StringBuffer::write(this_00,(int)cVar3,__buf,(size_t)__n);
      __buf_01 = extraout_RDX_01;
      pcVar7 = pcVar6 + 1;
    }
    else {
      p = pcVar6;
      if (cVar3 == '\0') break;
      pFVar4 = (FeatureIndex *)this_00;
      StringBuffer::write(this_00,(int)cVar3,__buf_01,(size_t)__n);
      __buf_01 = extraout_RDX_00;
      pcVar7 = pcVar6;
    }
    pcVar6 = pcVar7 + 1;
  } while( true );
  StringBuffer::write(this_00,0,__buf_01,(size_t)__n);
  pFVar4 = local_88;
  id = (*local_88->_vptr_FeatureIndex[6])();
  __buf_01 = extraout_RDX_06;
  if (id != -1) {
    pFVar4 = local_80;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_80,(value_type_conflict1 *)&id);
    __buf_01 = extraout_RDX_07;
  }
LAB_0010a099:
  __n = local_70 + 1;
  goto LAB_00109ec6;
}

Assistant:

bool FeatureIndex::buildUnigramFeature(LearnerPath *path,
                                       const char *ufeature) {
  scoped_fixed_array<char, BUFSIZE> ubuf;
  scoped_fixed_array<char *, POSSIZE> F;

  feature_.clear();
  std::strncpy(ubuf.get(), ufeature, ubuf.size());
  const size_t usize = tokenizeCSV(ubuf.get(), F.get(), F.size());

  for (std::vector<const char*>::const_iterator it = unigram_templs_.begin();
       it != unigram_templs_.end(); ++it) {
    const char *p = *it;
    os_.clear();

    for (; *p; p++) {
      switch (*p) {
        default: os_ << *p; break;
        case '\\': os_ << getEscapedChar(*++p); break;
        case '%': {
          switch (*++p) {
            case 'F':  {
              const char *r = getIndex(const_cast<char **>(&p), F.get(), usize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 't':  os_ << (size_t)path->rnode->char_type;     break;
            case 'u':  os_ << ufeature; break;
            case 'w':
              if (path->rnode->stat == MECAB_NOR_NODE) {
                os_.write(path->rnode->surface, path->rnode->length);
              }
            default:
              CHECK_DIE(false) << "unknown meta char: " <<  *p;
          }
        }
      }
    }

    os_ << '\0';
    ADDB(os_.str());

 NEXT: continue;
  }

  COPY_FEATURE(path->rnode->fvector);

  return true;
}